

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

IndexType GetIndexTypeFromPrimitive
                    (Var indexVar,ScriptContext *scriptContext,uint32 *index,
                    PropertyRecord **propertyRecord,JavascriptString **propertyNameString,
                    bool createIfNotFound,bool preferJavascriptStringOverPropertyRecord)

{
  bool bVar1;
  charcount_t propertyLength;
  IndexType IVar2;
  int iVar3;
  BOOL BVar4;
  JavascriptSymbol *pJVar5;
  JavascriptString *this;
  char16 *str;
  double value;
  uint32 local_88 [2];
  char16 stringBuffer [22];
  bool local_31 [8];
  bool isInt32;
  
  unique0x100001d3 = propertyNameString;
  bVar1 = Js::TaggedInt::Is(indexVar);
  if (bVar1) {
    local_88[0] = Js::TaggedInt::ToInt32(indexVar);
    if (-1 < (int)local_88[0]) {
LAB_00995208:
      *index = local_88[0];
      return IndexType_Number;
    }
    iVar3 = Js::TaggedInt::ToBuffer(local_88[0],(char16 *)local_88,0x16);
    if (createIfNotFound || preferJavascriptStringOverPropertyRecord) {
      Js::ScriptContext::GetOrAddPropertyRecord
                (scriptContext,stringBuffer + (long)iVar3 + -4,0x15 - iVar3,propertyRecord);
    }
    else {
      Js::ScriptContext::FindPropertyRecord
                (scriptContext,stringBuffer + (long)iVar3 + -4,0x15 - iVar3,propertyRecord);
    }
  }
  else {
    if ((ulong)indexVar >> 0x32 != 0) {
      local_88[0] = 0;
      local_31[0] = false;
      value = Js::JavascriptNumber::GetValue(indexVar);
      bVar1 = Js::JavascriptNumber::TryGetInt32OrUInt32Value(value,(int32 *)local_88,local_31);
      if ((bVar1) && ((local_88[0] == 0xffffffff | local_31[0]) != 1)) goto LAB_00995208;
    }
    bVar1 = Js::VarIs<Js::JavascriptSymbol>(indexVar);
    if ((!bVar1) ||
       (pJVar5 = Js::UnsafeVarTo<Js::JavascriptSymbol>(indexVar), pJVar5 == (JavascriptSymbol *)0x0)
       ) {
      this = Js::JavascriptConversion::ToString(indexVar,scriptContext);
      str = Js::JavascriptString::GetString(this);
      propertyLength = Js::JavascriptString::GetLength(this);
      if (!preferJavascriptStringOverPropertyRecord || createIfNotFound) {
        IVar2 = GetIndexTypeFromString
                          (str,propertyLength,scriptContext,index,propertyRecord,createIfNotFound);
        return IVar2;
      }
      BVar4 = Js::NumberUtilities::TryConvertToUInt32(str,propertyLength,index);
      if ((BVar4 != 0) && (*index != 0xffffffff)) {
        return IndexType_Number;
      }
      *stack0xffffffffffffffa8 = this;
      return IndexType_JavascriptString;
    }
    *propertyRecord = (pJVar5->propertyRecordUsageCache).propertyRecord.ptr;
  }
  return IndexType_PropertyId;
}

Assistant:

IndexType GetIndexTypeFromPrimitive(Var indexVar, ScriptContext* scriptContext, uint32* index, PropertyRecord const ** propertyRecord, JavascriptString ** propertyNameString, bool createIfNotFound, bool preferJavascriptStringOverPropertyRecord)
    {
        // CONSIDER: Only OP_SetElementI and OP_GetElementI use and take advantage of the
        // IndexType_JavascriptString result. Consider modifying other callers of GetIndexType to take
        // advantage of non-interned property strings where appropriate.
        if (TaggedInt::Is(indexVar))
        {
            int indexInt = TaggedInt::ToInt32(indexVar);
            if (indexInt >= 0)
            {
                *index = (uint)indexInt;
                return IndexType_Number;
            }
            else
            {
                char16 stringBuffer[22];

                int pos = TaggedInt::ToBuffer(indexInt, stringBuffer, _countof(stringBuffer));
                charcount_t length = (_countof(stringBuffer) - 1) - pos;
                if (createIfNotFound || preferJavascriptStringOverPropertyRecord)
                {
                    // When preferring JavascriptString objects, just return a PropertyRecord instead
                    // of creating temporary JavascriptString objects for every negative integer that
                    // comes through here.
                    scriptContext->GetOrAddPropertyRecord(stringBuffer + pos, length, propertyRecord);
                }
                else
                {
                    scriptContext->FindPropertyRecord(stringBuffer + pos, length, propertyRecord);
                }
                return IndexType_PropertyId;
            }
        }

        if (JavascriptNumber::Is_NoTaggedIntCheck(indexVar))
        {
            // If this double can be a positive integer index, convert it.
            int32 value = 0;
            bool isInt32 = false;
            if (JavascriptNumber::TryGetInt32OrUInt32Value(JavascriptNumber::GetValue(indexVar), &value, &isInt32)
                && !isInt32
                && static_cast<uint32>(value) < JavascriptArray::InvalidIndex)
            {
                *index = static_cast<uint32>(value);
                return IndexType_Number;
            }

            // Fall through to slow string conversion.
        }

        JavascriptSymbol * symbol = JavascriptOperators::TryFromVar<JavascriptSymbol>(indexVar);
        if (symbol)
        {
            // JavascriptSymbols cannot add a new PropertyRecord - they correspond to one and only one existing PropertyRecord.
            // We already know what the PropertyRecord is since it is stored in the JavascriptSymbol itself so just return it.

            *propertyRecord = symbol->GetValue();
            return IndexType_PropertyId;
        }
        else
        {
            JavascriptString* indexStr = JavascriptConversion::ToString(indexVar, scriptContext);

            char16 const * propertyName = indexStr->GetString();
            charcount_t const propertyLength = indexStr->GetLength();

            if (!createIfNotFound && preferJavascriptStringOverPropertyRecord)
            {
                if (JavascriptOperators::TryConvertToUInt32(propertyName, propertyLength, index) &&
                    (*index != JavascriptArray::InvalidIndex))
                {
                    return IndexType_Number;
                }

                *propertyNameString = indexStr;
                return IndexType_JavascriptString;
            }
            return GetIndexTypeFromString(propertyName, propertyLength, scriptContext, index, propertyRecord, createIfNotFound);
        }
    }